

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

void PerlinNoiseTest<Blob<128>>
               (int Xbits,int Ybits,int inputLen,int step,pfHash hash,
               vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  pfHash p_Var1;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *this;
  undefined4 in_register_0000000c;
  uint32_t uVar2;
  undefined4 in_register_00000014;
  int iVar3;
  uint32_t uVar4;
  Blob<128> h;
  char key [256];
  int local_16c;
  uint32_t local_168;
  int local_164;
  size_t local_160;
  pfHash local_158;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *local_150;
  value_type local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  iVar3 = 1 << (Xbits & 0x1fU);
  local_78 = 0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  local_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  local_158 = hash;
  local_150 = hashes;
  printf("Testing %i coordinates (L%i) : \n",(ulong)(uint)(iVar3 << (Ybits & 0x1fU)),
         CONCAT44(in_register_00000014,inputLen),CONCAT44(in_register_0000000c,step));
  this = local_150;
  p_Var1 = local_158;
  local_16c = 0;
  if (Xbits != 0x1f) {
    uVar2 = 1 << (Ybits & 0x1fU);
    local_160 = (size_t)inputLen;
    if ((int)uVar2 < 2) {
      uVar2 = 1;
    }
    local_168 = uVar2;
    local_164 = 1;
    if (1 < iVar3) {
      local_164 = iVar3;
    }
    do {
      iVar3 = local_16c;
      memcpy(&local_138,&local_16c,local_160);
      if (Ybits != 0x1f) {
        uVar4 = 0;
        do {
          local_148.bytes[0] = '\0';
          local_148.bytes[1] = '\0';
          local_148.bytes[2] = '\0';
          local_148.bytes[3] = '\0';
          local_148.bytes[4] = '\0';
          local_148.bytes[5] = '\0';
          local_148.bytes[6] = '\0';
          local_148.bytes[7] = '\0';
          local_148.bytes[8] = '\0';
          local_148.bytes[9] = '\0';
          local_148.bytes[10] = '\0';
          local_148.bytes[0xb] = '\0';
          local_148.bytes[0xc] = '\0';
          local_148.bytes[0xd] = '\0';
          local_148.bytes[0xe] = '\0';
          local_148.bytes[0xf] = '\0';
          (*p_Var1)(&local_138,inputLen,uVar4,&local_148);
          std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back(this,&local_148);
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      local_16c = iVar3 + 1;
    } while (local_16c != local_164);
  }
  return;
}

Assistant:

void PerlinNoiseTest (int Xbits, int Ybits,
                      int inputLen, int step,
                      pfHash hash, std::vector<hashtype> & hashes )
{
  assert(0 < Ybits && Ybits < 31);
  assert(0 < Xbits && Xbits < 31);
  assert(inputLen*8 > Xbits);  // enough space to run the test

  int const xMax = (1 << Xbits);
  int const yMax = (1 << Ybits);

  assert(Xbits + Ybits < 31);

#define INPUT_LEN_MAX 256
  assert(inputLen <= INPUT_LEN_MAX);
  char key[INPUT_LEN_MAX] = {0};

  printf("Testing %i coordinates (L%i) : \n", xMax * yMax, inputLen);

  for(int x = 0; x < xMax; x++) {
      memcpy(key, &x, inputLen);  // Note : only works with Little Endian
      for (int y=0; y < yMax; y++) {
          hashtype h;
          hash(key, inputLen, y, &h);
          hashes.push_back(h);
      }
  }
}